

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double derivative_in_direction(vw *all,bfgs *b,float *mem,int *origin)

{
  double dVar1;
  
  if ((all->weights).sparse == true) {
    dVar1 = derivative_in_direction<sparse_parameters>
                      (all,b,mem,origin,&(all->weights).sparse_weights);
    return dVar1;
  }
  dVar1 = derivative_in_direction<dense_parameters>(all,b,mem,origin,&(all->weights).dense_weights);
  return dVar1;
}

Assistant:

double derivative_in_direction(vw& all, bfgs& b, float* mem, int& origin)
{
  if (all.weights.sparse)
    return derivative_in_direction(all, b, mem, origin, all.weights.sparse_weights);
  else
    return derivative_in_direction(all, b, mem, origin, all.weights.dense_weights);
}